

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O0

void nni_ctx_rele(nni_ctx *ctx)

{
  nni_sock *pnVar1;
  nni_sock *sock;
  nni_ctx *ctx_local;
  
  pnVar1 = ctx->c_sock;
  nni_mtx_lock(&sock_lk);
  ctx->c_ref = ctx->c_ref - 1;
  if ((ctx->c_ref == 0) && ((ctx->c_closed & 1U) != 0)) {
    nni_id_remove(&ctx_ids,(ulong)ctx->c_id);
    nni_list_remove(&pnVar1->s_ctxs,ctx);
    nni_cv_wake(&pnVar1->s_close_cv);
    nni_mtx_unlock(&sock_lk);
    nni_ctx_destroy(ctx);
  }
  else {
    nni_mtx_unlock(&sock_lk);
  }
  return;
}

Assistant:

void
nni_ctx_rele(nni_ctx *ctx)
{
	nni_sock *sock = ctx->c_sock;
	nni_mtx_lock(&sock_lk);
	ctx->c_ref--;
	if ((ctx->c_ref > 0) || (!ctx->c_closed)) {
		// Either still have an active reference, or not
		// actually closing yet.
		nni_mtx_unlock(&sock_lk);
		return;
	}

	// Remove us from the hash, so we can't be found any more.
	// This allows our ID to be reused later, although the system
	// tries to avoid ID reuse.
	nni_id_remove(&ctx_ids, ctx->c_id);
	nni_list_remove(&sock->s_ctxs, ctx);
	nni_cv_wake(&sock->s_close_cv);
	nni_mtx_unlock(&sock_lk);

	nni_ctx_destroy(ctx);
}